

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O0

void __thiscall
cplus::utils::Set<cplus::lang::String>::TreeNode::forEach
          (TreeNode *this,function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_*)> *func)

{
  bool bVar1;
  TreeNode *pTVar2;
  TreeNode *local_88;
  TreeNode *local_80 [3];
  undefined1 local_68 [8];
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> taskQueue;
  TreeNode *state;
  function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_*)> *func_local;
  TreeNode *this_local;
  
  taskQueue.blockArrayStack._32_8_ = this;
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::ArrayStack
            ((ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *)local_68);
  do {
    if (taskQueue.blockArrayStack._32_8_ == 0) break;
    std::function<void_(cplus::utils::Set<cplus::lang::String>::TreeNode_*)>::operator()
              (func,(TreeNode *)taskQueue.blockArrayStack._32_8_);
    pTVar2 = getLeft((TreeNode *)taskQueue.blockArrayStack._32_8_);
    if (pTVar2 != (TreeNode *)0x0) {
      local_80[0] = getLeft((TreeNode *)taskQueue.blockArrayStack._32_8_);
      ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push
                ((ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *)local_68,local_80
                );
    }
    pTVar2 = getRight((TreeNode *)taskQueue.blockArrayStack._32_8_);
    if (pTVar2 != (TreeNode *)0x0) {
      local_88 = getRight((TreeNode *)taskQueue.blockArrayStack._32_8_);
      ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::push
                ((ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *)local_68,
                 &local_88);
    }
    bVar1 = ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::pop
                      ((ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *)local_68,
                       (TreeNode **)&taskQueue.blockArrayStack.stackSize);
  } while (bVar1);
  ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*>::~ArrayStack
            ((ArrayStack<cplus::utils::Set<cplus::lang::String>::TreeNode_*> *)local_68);
  return;
}

Assistant:

void forEach(std::function<void(TreeNode *)> func) {
					TreeNode *state = this;
					ArrayStack<TreeNode *> taskQueue;
					while (state != nullptr) {
						func(state);
						if (state->getLeft() != nullptr)taskQueue.push(state->getLeft());
						if (state->getRight() != nullptr)taskQueue.push(state->getRight());
						if (!taskQueue.pop(state))break;
					}
				}